

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParsePHPCoverage.cxx
# Opt level: O0

bool __thiscall cmParsePHPCoverage::ReadArraySize(cmParsePHPCoverage *this,istream *in,int *size)

{
  char c;
  int *size_local;
  istream *in_local;
  cmParsePHPCoverage *this_local;
  
  std::istream::get((char *)in);
  return false;
}

Assistant:

bool cmParsePHPCoverage::ReadArraySize(std::istream& in, int& size)
{
  char c = 0;
  in.get(c);
  if(c != 'a')
    {
    return false;
    }
  if(in.get(c) && c == ':')
    {
    if(this->ReadInt(in, size))
      {
      return true;
      }
    }
  return false;
}